

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O0

Gia_Man_t * Gia_ManCofStructure(Gia_Man_t *p)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  int iVar3;
  Gia_Man_t *local_48;
  Vec_Wec_t *local_40;
  Gia_Man_t *pTemp;
  Vec_Int_t *vMap;
  Vec_Wec_t *vCfs;
  Vec_Int_t *vIns;
  Gia_Man_t *pNew;
  Gia_Man_t *p_local;
  
  vIns = (Vec_Int_t *)0x0;
  pNew = p;
  vCfs = (Vec_Wec_t *)Gia_ManFindSharedInputs(p);
  if (vCfs == (Vec_Wec_t *)0x0) {
    local_40 = (Vec_Wec_t *)0x0;
  }
  else {
    local_40 = Gia_ManFindCofs(pNew,(Vec_Int_t *)vCfs,(Gia_Man_t **)&vIns);
  }
  vMap = (Vec_Int_t *)local_40;
  if (local_40 == (Vec_Wec_t *)0x0) {
    local_48 = (Gia_Man_t *)0x0;
  }
  else {
    local_48 = (Gia_Man_t *)Gia_ManFindEquivClasses(local_40);
  }
  pTemp = local_48;
  if (local_48 != (Gia_Man_t *)0x0) {
    iVar2 = Vec_IntFindMax((Vec_Int_t *)local_48);
    iVar2 = Abc_Base2Log(iVar2 + 1);
    iVar3 = Vec_IntSize((Vec_Int_t *)vCfs);
    pVVar1 = vIns;
    if (iVar2 < iVar3) {
      iVar2 = Gia_ManCoNum(pNew);
      Gia_ManFindDerive((Gia_Man_t *)pVVar1,iVar2,(Vec_Int_t *)vCfs,(Vec_Wec_t *)vMap,
                        (Vec_Int_t *)pTemp);
      pVVar1 = vIns;
      vIns = (Vec_Int_t *)Gia_ManCleanup((Gia_Man_t *)vIns);
      Gia_ManStop((Gia_Man_t *)pVVar1);
      goto LAB_0022e5c1;
    }
  }
  Gia_ManStopP((Gia_Man_t **)&vIns);
LAB_0022e5c1:
  Vec_WecFreeP((Vec_Wec_t **)&vMap);
  Vec_IntFreeP((Vec_Int_t **)&pTemp);
  Vec_IntFreeP((Vec_Int_t **)&vCfs);
  return (Gia_Man_t *)vIns;
}

Assistant:

Gia_Man_t * Gia_ManCofStructure( Gia_Man_t * p )
{
    Gia_Man_t * pNew = NULL;
    Vec_Int_t * vIns = Gia_ManFindSharedInputs( p );
    Vec_Wec_t * vCfs = vIns ? Gia_ManFindCofs( p, vIns, &pNew ) : NULL;
    Vec_Int_t * vMap = vCfs ? Gia_ManFindEquivClasses( vCfs ) : NULL;
    if ( vMap && Abc_Base2Log(Vec_IntFindMax(vMap)+1) < Vec_IntSize(vIns) ) 
    {
        Gia_Man_t * pTemp; 
        Gia_ManFindDerive( pNew, Gia_ManCoNum(p), vIns, vCfs, vMap );
        pNew = Gia_ManCleanup( pTemp = pNew );
        Gia_ManStop( pTemp );
    }
    else
        Gia_ManStopP( &pNew );
    Vec_WecFreeP( &vCfs );
    Vec_IntFreeP( &vMap );
    Vec_IntFreeP( &vIns );
    return pNew;
}